

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-passwd.c
# Opt level: O2

int run_test_get_passwd(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_40;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_get_passwd(&pwd);
  pcVar3 = pwd.homedir;
  if (iVar1 == 0) {
    if (*pwd.username == '\0') {
      pcVar3 = "len > 0";
      uStack_40 = 0x23;
    }
    else if (*pwd.shell == '\0') {
      pcVar3 = "len > 0";
      uStack_40 = 0x29;
    }
    else {
      sVar2 = strlen(pwd.homedir);
      if (sVar2 == 1) {
        if (*pcVar3 != '/') {
          pcVar3 = "pwd.homedir[0] == \'/\'";
          uStack_40 = 0x36;
          goto LAB_0012ebcd;
        }
      }
      else {
        if (sVar2 == 0) {
          pcVar3 = "len > 0";
          uStack_40 = 0x2d;
          goto LAB_0012ebcd;
        }
        if (pcVar3[sVar2 - 1] == '/') {
          pcVar3 = "pwd.homedir[len - 1] != \'/\'";
          uStack_40 = 0x38;
          goto LAB_0012ebcd;
        }
      }
      if (pwd.uid < 0) {
        pcVar3 = "pwd.uid >= 0";
        uStack_40 = 0x3f;
      }
      else if (pwd.gid < 0) {
        pcVar3 = "pwd.gid >= 0";
        uStack_40 = 0x40;
      }
      else {
        uv_os_free_passwd(&pwd);
        if (pwd.username == (char *)0x0) {
          if (pwd.shell == (char *)0x0) {
            if (pwd.homedir == (char *)0x0) {
              uv_os_free_passwd(&pwd);
              if (pwd.username == (char *)0x0) {
                if (pwd.shell == (char *)0x0) {
                  if (pwd.homedir == (char *)0x0) {
                    iVar1 = uv_os_get_passwd(0);
                    if (iVar1 == -0x16) {
                      return 0;
                    }
                    pcVar3 = "r == UV_EINVAL";
                    uStack_40 = 0x53;
                  }
                  else {
                    pcVar3 = "pwd.homedir == NULL";
                    uStack_40 = 0x4f;
                  }
                }
                else {
                  pcVar3 = "pwd.shell == NULL";
                  uStack_40 = 0x4e;
                }
              }
              else {
                pcVar3 = "pwd.username == NULL";
                uStack_40 = 0x4d;
              }
            }
            else {
              pcVar3 = "pwd.homedir == NULL";
              uStack_40 = 0x48;
            }
          }
          else {
            pcVar3 = "pwd.shell == NULL";
            uStack_40 = 0x47;
          }
        }
        else {
          pcVar3 = "pwd.username == NULL";
          uStack_40 = 0x46;
        }
      }
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_40 = 0x21;
  }
LAB_0012ebcd:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-passwd.c"
          ,uStack_40,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(get_passwd) {
  uv_passwd_t pwd;
  size_t len;
  int r;

  /* Test the normal case */
  r = uv_os_get_passwd(&pwd);
  ASSERT(r == 0);
  len = strlen(pwd.username);
  ASSERT(len > 0);

#ifdef _WIN32
  ASSERT(pwd.shell == NULL);
#else
  len = strlen(pwd.shell);
  ASSERT(len > 0);
#endif

  len = strlen(pwd.homedir);
  ASSERT(len > 0);

#ifdef _WIN32
  if (len == 3 && pwd.homedir[1] == ':')
    ASSERT(pwd.homedir[2] == '\\');
  else
    ASSERT(pwd.homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(pwd.homedir[0] == '/');
  else
    ASSERT(pwd.homedir[len - 1] != '/');
#endif

#ifdef _WIN32
  ASSERT(pwd.uid == -1);
  ASSERT(pwd.gid == -1);
#else
  ASSERT(pwd.uid >= 0);
  ASSERT(pwd.gid >= 0);
#endif

  /* Test uv_os_free_passwd() */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test a double free */
  uv_os_free_passwd(&pwd);

  ASSERT(pwd.username == NULL);
  ASSERT(pwd.shell == NULL);
  ASSERT(pwd.homedir == NULL);

  /* Test invalid input */
  r = uv_os_get_passwd(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}